

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * units::clean_unit_string
                   (string *__return_storage_ptr__,string *propUnitString,uint32_t commodity)

{
  char *pcVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  string *psVar6;
  string *psVar7;
  char cVar8;
  long lVar9;
  precise_unit pVar10;
  string cString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (lVar9 = 0; lVar9 != 0x108; lVar9 = lVar9 + 0x18) {
    uVar5 = *(ulong *)((long)&clean_unit_string::powerseq._M_elems[0].
                              super__Tuple_impl<0UL,_const_char_*,_const_char_*,_int,_int>.
                              super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar9);
    while (uVar4 = std::__cxx11::string::find((char *)propUnitString,uVar5),
          uVar4 != 0xffffffffffffffff) {
      std::__cxx11::string::replace
                ((ulong)propUnitString,uVar4,
                 (char *)(long)*(int *)((long)&clean_unit_string::powerseq._M_elems[0].
                                               super__Tuple_impl<0UL,_const_char_*,_const_char_*,_int,_int>
                                               .super__Tuple_impl<1UL,_const_char_*,_int,_int>.
                                               super__Tuple_impl<2UL,_int,_int>.
                                               super__Head_base<2UL,_int,_false>._M_head_impl +
                                       lVar9));
    }
  }
  cVar8 = (char)propUnitString;
  if (propUnitString->_M_string_length != 0) {
    pcVar1 = (propUnitString->_M_dataplus)._M_p;
    if (((*pcVar1 == '(') && (pcVar1[propUnitString->_M_string_length - 1] == ')')) &&
       (lVar9 = std::__cxx11::string::find(cVar8,0x28), lVar9 == -1)) {
      std::__cxx11::string::pop_back();
      std::__cxx11::string::erase(propUnitString,(propUnitString->_M_dataplus)._M_p);
    }
    lVar9 = std::__cxx11::string::find((char *)propUnitString,0x1684e0);
    if (lVar9 != -1) {
      reduce_number_length(propUnitString,'0');
    }
    lVar9 = std::__cxx11::string::find((char *)propUnitString,0x1681db);
    if (lVar9 != -1) {
      reduce_number_length(propUnitString,'9');
    }
  }
  if (commodity != 0) {
    getCommodityName_abi_cxx11_(0x14b068);
    iVar3 = std::__cxx11::string::compare((ulong)&cString,0,(char *)0x7);
    if (iVar3 != 0) {
LAB_0014b09a:
      uVar5 = std::__cxx11::string::find_first_of((char *)&cString,0x1681f0);
      if (uVar5 == 0) goto LAB_0014b0c3;
      if (uVar5 != 0xffffffffffffffff) goto code_r0x0014b0b6;
    }
    std::__cxx11::string::insert(&cString,cString._M_dataplus._M_p,0x7b);
    std::__cxx11::string::push_back((char)&cString);
    if ((int)commodity < 0) {
      psVar6 = (string *)std::__cxx11::string::rfind(cVar8,0x2f);
      if (psVar6 == (string *)0xffffffffffffffff) {
        pVar10 = checkForCustomUnit(&cString);
        if (pVar10.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar10.multiplier_)) {
          std::__cxx11::string::insert((ulong)&cString,0,'\x01');
        }
        if (propUnitString->_M_string_length == 0) {
          std::__cxx11::string::push_back(cVar8);
        }
        std::__cxx11::string::push_back(cVar8);
        std::__cxx11::string::append((string *)propUnitString);
      }
      else {
        psVar7 = (string *)std::__cxx11::string::find_last_of((char *)propUnitString,0x1681ed);
        if (psVar7 == (string *)0xffffffffffffffff || psVar7 < psVar6) {
          std::__cxx11::string::append((string *)propUnitString);
        }
        else {
          std::__cxx11::string::insert((ulong)propUnitString,psVar7);
        }
      }
    }
    else {
      lVar9 = std::__cxx11::string::find_last_of((char *)propUnitString,0x16cb54);
      if (lVar9 == -1) {
        std::__cxx11::string::append((string *)propUnitString);
      }
      else {
        iVar3 = std::__cxx11::string::compare((ulong)propUnitString,0,(char *)0x2);
        if (iVar3 == 0) {
          pVar10 = checkForCustomUnit(&cString);
          if (pVar10.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar10.multiplier_)) {
            std::__cxx11::string::insert((ulong)&cString,0,'\x01');
          }
          std::__cxx11::string::replace((ulong)propUnitString,0,(char *)0x1);
        }
        else {
          psVar6 = (string *)std::__cxx11::string::find_first_of((char *)propUnitString,0x1681e9);
          pcVar2 = (propUnitString->_M_dataplus)._M_p;
          if ((psVar6[(long)pcVar2] == (string)0x5e) && (psVar6[(long)(pcVar2 + 1)] == (string)0x2d)
             ) {
            pVar10 = checkForCustomUnit(&cString);
            if (pVar10.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar10.multiplier_)) {
              std::__cxx11::string::insert((ulong)&cString,0,'\x01');
            }
            std::operator+(&local_70,&cString,"*");
            std::operator+(&local_50,&local_70,propUnitString);
            std::__cxx11::string::operator=((string *)propUnitString,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
          }
          else {
            std::__cxx11::string::insert((ulong)propUnitString,psVar6);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&cString);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)propUnitString);
  return __return_storage_ptr__;
code_r0x0014b0b6:
  if (cString._M_dataplus._M_p[uVar5 - 1] != '\\') {
LAB_0014b0c3:
    std::__cxx11::string::insert((ulong)&cString,uVar5,'\x01');
  }
  goto LAB_0014b09a;
}

Assistant:

static std::string
    clean_unit_string(std::string propUnitString, std::uint32_t commodity)
{
    using spair = std::tuple<const char*, const char*, int, int>;
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<spair, 11> powerseq{
        {spair{"Mm^3", "(1e9km^3)", 4, 8},  // this needs to happen before ^3^2
                                            // conversions
         spair{"^2^2", "^4", 4, 2},
         spair{"^3^2", "^6", 4, 2},
         spair{"^2^3", "^6", 4, 2},
         spair{"^3^3", "^9", 4, 2},  // this can only happen with extended units
         spair{"Gs", "Bs", 2, 2},
         spair{"*K^", "*1*K^", 3, 5},  // this one is to prevent the next from
                                       // screwing things up
         spair{"eflag*K", "degC", 7, 4},
         spair{"*1*", "*", 3, 1},
         spair{"*1/", "/", 3, 1},
         spair{"*/", "/", 2, 1}}};
    // run a few checks for unusual conditions
    for (const auto& pseq : powerseq) {
        auto fnd = propUnitString.find(std::get<0>(pseq));
        while (fnd != std::string::npos) {
            propUnitString.replace(fnd, std::get<2>(pseq), std::get<1>(pseq));
            fnd =
                propUnitString.find(std::get<0>(pseq), fnd + std::get<3>(pseq));
        }
    }

    if (!propUnitString.empty()) {
        if (propUnitString.front() == '(' && propUnitString.back() == ')') {
            if (propUnitString.find_first_of('(', 1) == std::string::npos) {
                propUnitString.pop_back();
                propUnitString.erase(propUnitString.begin());
            }
        }
        if (propUnitString.find("00000") != std::string::npos) {
            reduce_number_length(propUnitString, '0');
        }
        if (propUnitString.find("99999") != std::string::npos) {
            reduce_number_length(propUnitString, '9');
        }
    }

    // no more cleaning necessary
    if (commodity == 0 && !propUnitString.empty() &&
        !isDigitCharacter(propUnitString.front())) {
        return propUnitString;
    }

    if (commodity != 0) {
        std::string cString = getCommodityName(
            ((commodity & 0x80000000) == 0) ? commodity : (~commodity));
        if (cString.compare(0, 7, "CXCOMM[") != 0) {
            // add some escapes for problematic sequences
            escapeString(cString);
        }
        // make it look like a commodity sequence
        cString.insert(cString.begin(), '{');
        cString.push_back('}');
        if ((commodity & 0x80000000) == 0) {
            auto loc = propUnitString.find_last_of("/^");
            if (loc == std::string::npos) {
                propUnitString += cString;
            } else if (propUnitString.compare(0, 2, "1/") == 0) {
                auto rs = checkForCustomUnit(cString);
                if (!is_error(rs)) {
                    cString.insert(0, 1, '1');
                }
                propUnitString.replace(0, 1, cString.c_str());
            } else {
                auto locp = propUnitString.find_first_of("^*/");
                if (propUnitString[locp] != '^' ||
                    propUnitString[locp + 1] != '-') {
                    propUnitString.insert(locp, cString);
                } else {
                    auto rs = checkForCustomUnit(cString);
                    if (!is_error(rs)) {
                        // this condition would take a very particular and odd
                        // string to trigger I haven't figured out a test case
                        // for it yet

                        // LCOV_EXCL_START
                        cString.insert(0, 1, '1');
                        // LCOV_EXCL_STOP
                    }
                    propUnitString = cString + "*" + propUnitString;
                }
            }
        } else {  // inverse commodity
            auto loc = propUnitString.find_last_of('/');
            if (loc == std::string::npos) {
                auto rs = checkForCustomUnit(cString);
                if (!is_error(rs)) {  // this check is needed because it is
                                      // possible to define a commodity that
                                      // would look like a form
                    // of custom unit
                    // The '1' forces the interpreter to interpret it as purely
                    // a commodity, but is only needed in very particular
                    // circumstances
                    cString.insert(0, 1, '1');
                }
                if (propUnitString.empty()) {
                    propUnitString.push_back('1');
                }
                propUnitString.push_back('/');
                propUnitString.append(cString);
            } else {
                auto locp = propUnitString.find_last_of("^*");
                if (locp == std::string::npos || locp < loc) {
                    propUnitString.append(cString);
                } else {
                    propUnitString.insert(locp, cString);
                }
            }
        }
    }
    return propUnitString;
}